

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void conversion_operator_suite::get_integer(void)

{
  bool v;
  int iVar1;
  float fVar2;
  error *ex_6;
  error *ex_5;
  error *ex_4;
  error *ex_3;
  error *ex_2;
  error *ex_1;
  error *ex;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_38,2);
  trial::dynamic::basic_variable::operator_cast_to_nullable((basic_variable *)local_38);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator nullable()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe35,"void conversion_operator_suite::get_integer()");
  v = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)local_38);
  boost::detail::test_impl
            ("bool(data) == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe36,"void conversion_operator_suite::get_integer()",v);
  iVar1 = trial::dynamic::basic_variable::operator_cast_to_int((basic_variable *)local_38);
  boost::detail::test_impl
            ("int(data) == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe37,"void conversion_operator_suite::get_integer()",iVar1 == 2);
  fVar2 = trial::dynamic::basic_variable::operator_cast_to_float((basic_variable *)local_38);
  boost::detail::test_impl
            ("float(data) == 2.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe38,"void conversion_operator_suite::get_integer()",(bool)(-(fVar2 == 2.0) & 1));
  trial::dynamic::basic_variable::operator_cast_to_string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex_1,
             (basic_variable *)local_38);
  std::__cxx11::string::~string((string *)&ex_1);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe3b,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable::operator_cast_to_wstring
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ex_2,
             (basic_variable *)local_38);
  std::__cxx11::wstring::~wstring((wstring *)&ex_2);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::wstring_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe3e,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable::operator_cast_to_u16string
            ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)&ex_3,
             (basic_variable *)local_38);
  std::__cxx11::u16string::~u16string((u16string *)&ex_3);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::u16string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe41,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable::operator_cast_to_u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)&ex_4,
             (basic_variable *)local_38);
  std::__cxx11::u32string::~u32string((u32string *)&ex_4);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::u32string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe44,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable::operator_cast_to_vector
            ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              *)&ex_5,(basic_variable *)local_38);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)&ex_5);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::array_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe47,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable::operator_cast_to_map
            ((map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)&ex_6,(basic_variable *)local_38);
  std::
  map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~map((map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
          *)&ex_6);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator variable::map_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe4a,"void conversion_operator_suite::get_integer()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void get_integer()
{
    variable data(2);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator nullable(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST(bool(data) == true);
    TRIAL_PROTOCOL_TEST(int(data) == 2);
    TRIAL_PROTOCOL_TEST(float(data) == 2.0f);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::wstring_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u16string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u32string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::array_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::map_type(),
                                    error,
                                    "incompatible type");
}